

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

Enum * __thiscall
kratos::Generator::enum_
          (Generator *this,string *enum_name,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *definition,uint32_t width)

{
  uint32_t local_3c;
  undefined1 auStack_38 [4];
  uint32_t width_local;
  shared_ptr<kratos::Enum> p;
  
  local_3c = width;
  std::__shared_ptr<kratos::Enum,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<kratos::Enum>,std::__cxx11::string_const&,std::map<std::__cxx11::string,unsigned_long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>const&,unsigned_int&>
            ((__shared_ptr<kratos::Enum,(__gnu_cxx::_Lock_policy)2> *)auStack_38,
             (allocator<kratos::Enum> *)
             ((long)&p.super___shared_ptr<kratos::Enum,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7),enum_name,definition,&local_3c);
  Enum::verify_naming_conflict(&this->enums_,enum_name,definition);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Enum>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Enum>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Enum>>>>
  ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::Enum>&>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Enum>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Enum>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Enum>>>>
              *)&this->enums_,enum_name,(shared_ptr<kratos::Enum> *)auStack_38);
  if (p.super___shared_ptr<kratos::Enum,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
  {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               p.super___shared_ptr<kratos::Enum,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return _auStack_38;
}

Assistant:

Enum &Generator::enum_(const std::string &enum_name,
                       const std::map<std::string, uint64_t> &definition, uint32_t width) {
    auto p = std::make_shared<Enum>(enum_name, definition, width);
    Enum::verify_naming_conflict(enums_, enum_name, definition);
    enums_.emplace(enum_name, p);
    return *p;
}